

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void removeDataBefore(Box<objectbox::tsdemo::SensorValues> box,int64_t time)

{
  ostream *poVar1;
  QueryBuilderBase *this;
  StopWatch stopWatch;
  QueryBuilder<objectbox::tsdemo::SensorValues> queryBuilder;
  undefined1 local_60 [12];
  QueryOp local_54;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  duration local_40;
  QueryBuilderBase local_38;
  
  obx::Box<objectbox::tsdemo::SensorValues>::query
            ((QueryBuilder<objectbox::tsdemo::SensorValues> *)&local_38,
             (Box<objectbox::tsdemo::SensorValues> *)&box.super_BoxTypeless);
  local_60._8_4_ = (PropertyTypeless)0x2;
  local_54 = Less;
  local_60._0_8_ = &PTR__QueryCondition_00112a30;
  local_50._8_8_ = 0;
  local_50._M_allocated_capacity = time;
  obx::anon_unknown_3::QCInt64::applyTo((QCInt64 *)local_60,local_38.cQueryBuilder_,false);
  local_40.__r = std::chrono::_V2::steady_clock::now();
  this = &local_38;
  obx::QueryBuilder<objectbox::tsdemo::SensorValues>::build
            ((Query<objectbox::tsdemo::SensorValues> *)local_60,
             (QueryBuilder<objectbox::tsdemo::SensorValues> *)this);
  obx::QueryBase::remove((QueryBase *)local_60,(char *)this);
  obx::QueryBase::~QueryBase((QueryBase *)local_60);
  poVar1 = std::operator<<((ostream *)&std::cout,"Removed old objects in ");
  objectbox::StopWatch::durationForLog_abi_cxx11_((string *)local_60,(StopWatch *)&local_40);
  poVar1 = std::operator<<(poVar1,(string *)local_60);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," objects)");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_60);
  poVar1 = std::operator<<((ostream *)&std::cout,"Total objects in DB: ");
  obx::BoxTypeless::count(&box.super_BoxTypeless,0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  obx::QueryBuilderBase::~QueryBuilderBase(&local_38);
  return;
}

Assistant:

void removeDataBefore(obx::Box<SensorValues> box, int64_t time) {
    obx::QueryBuilder<SensorValues> queryBuilder = box.query();
    queryBuilder.with(SensorValues_::time.lessThan(time));
    StopWatch stopWatch;
    size_t removeCount = queryBuilder.build().remove();
    std::cout << "Removed old objects in " << stopWatch.durationForLog() << " (" << removeCount << " objects)"
              << std::endl;

    std::cout << "Total objects in DB: " << box.count() << std::endl;
}